

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

ssize_t __thiscall Instance::read(Instance *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  FILE *__stream;
  undefined4 extraout_var;
  runtime_error *prVar3;
  void *__buf_00;
  size_t __nbytes_00;
  undefined4 in_register_00000034;
  char *__filename;
  char *__buf_01;
  char _error_msg_ [256];
  char acStack_118 [256];
  
  __filename = (char *)CONCAT44(in_register_00000034,__fd);
  __buf_01 = acStack_118;
  __stream = fopen(__filename,"r");
  if (__stream != (FILE *)0x0) {
    bVar1 = check_ext(__filename,".vbp");
    __buf_00 = (void *)0x0;
    if (!bVar1) {
      bVar1 = check_ext(__filename,".mvp");
      __buf_00 = (void *)0x1;
      if (!bVar1) goto LAB_00104be4;
    }
    read(this,(int)__stream,__buf_00,__nbytes);
    iVar2 = fclose(__stream);
    return CONCAT44(extraout_var,iVar2);
  }
  perror("fopen");
  snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","fin != NULL"
           ,
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
           ,0x5f);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,acStack_118);
  read((int)prVar3,__buf_01,__nbytes_00);
LAB_00104be4:
  snprintf(acStack_118,0x100,"Error: `%s` in \"%s\" line %d","Invalid file extension",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
           ,0x65);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,acStack_118);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Instance::read(const char *fname) {
	FILE *fin = fopen(fname, "r");
	if (fin == NULL) {
		perror("fopen");
	}
	throw_assert(fin != NULL);
	if (check_ext(fname, ".vbp")) {
		read(fin, VBP);
	} else if (check_ext(fname, ".mvp")) {
		read(fin, MVP);
	} else {
		throw_error("Invalid file extension");
	}
	fclose(fin);
}